

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getaddrinfo.c
# Opt level: O2

void uv__getaddrinfo_done(uv__work *w,int status)

{
  uint __line;
  uv_loop_s *puVar1;
  char *__assertion;
  
  if ((long)w[-1].wq[1] + 0x20 == *(long *)((long)w[-1].wq[1] + 0x20)) {
    __assertion = "uv__has_active_reqs(req->loop)";
    __line = 0x2d;
  }
  else {
    puVar1 = w[-1].loop;
    *(uv_loop_s **)w[-1].wq[0] = puVar1;
    *(void **)&puVar1->active_handles = w[-1].wq[0];
    puVar1 = (uv_loop_s *)w[1].done;
    w[1].wq[1] = (void *)0x0;
    if (((puVar1 != (uv_loop_s *)0x0) ||
        (puVar1 = (uv_loop_s *)w[1].wq[0], puVar1 != (uv_loop_s *)0x0)) ||
       (puVar1 = w[1].loop, puVar1 != (uv_loop_s *)0x0)) {
      free(puVar1);
      w[1].wq[0] = (void *)0x0;
      w[1].done = (_func_void_uv__work_ptr_int *)0x0;
      w[1].loop = (uv_loop_s *)0x0;
      if (status == -0x7d) {
        if (*(int *)&w[2].work != 0) {
          __assertion = "req->retcode == 0";
          __line = 0x41;
          goto LAB_0010c5fa;
        }
        *(undefined4 *)&w[2].work = 0xfffff445;
      }
      (*w[1].work)(w + -1);
      return;
    }
    __assertion = "0";
    __line = 0x3a;
  }
LAB_0010c5fa:
  __assert_fail(__assertion,"src/unix/getaddrinfo.c",__line,
                "void uv__getaddrinfo_done(struct uv__work *, int)");
}

Assistant:

static void uv__getaddrinfo_done(struct uv__work* w, int status) {
  uv_getaddrinfo_t* req;
  struct addrinfo *res;

  req = container_of(w, uv_getaddrinfo_t, work_req);
  uv__req_unregister(req->loop, req);

  res = req->res;
  req->res = NULL;

  /* See initialization in uv_getaddrinfo(). */
  if (req->hints)
    free(req->hints);
  else if (req->service)
    free(req->service);
  else if (req->hostname)
    free(req->hostname);
  else
    assert(0);

  req->hints = NULL;
  req->service = NULL;
  req->hostname = NULL;

  if (status == -ECANCELED) {
    assert(req->retcode == 0);
    req->retcode = UV_EAI_CANCELED;
  }

  req->cb(req, req->retcode, res);
}